

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateDebugToolStackQueries(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiStackTool *pIVar3;
  ImGuiStackLevelInfo *pIVar4;
  int stack_level;
  ImGuiID query_id;
  ImGuiStackTool *tool;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  ImGuiID IVar5;
  
  pIVar2 = GImGui;
  pIVar3 = &GImGui->DebugStackTool;
  GImGui->DebugHookIdInfo = 0;
  if (pIVar2->FrameCount == pIVar3->LastActiveFrame + 1) {
    if (pIVar2->HoveredIdPreviousFrame == 0) {
      IVar5 = pIVar2->ActiveId;
    }
    else {
      IVar5 = pIVar2->HoveredIdPreviousFrame;
    }
    if ((pIVar2->DebugStackTool).QueryId != IVar5) {
      (pIVar2->DebugStackTool).QueryId = IVar5;
      (pIVar2->DebugStackTool).StackLevel = -1;
      ImVector<ImGuiStackLevelInfo>::resize
                ((ImVector<ImGuiStackLevelInfo> *)CONCAT44(IVar5,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    }
    if (IVar5 != 0) {
      iVar1 = (pIVar2->DebugStackTool).StackLevel;
      if (((-1 < iVar1) && (iVar1 < (pIVar2->DebugStackTool).Results.Size)) &&
         ((pIVar4 = ImVector<ImGuiStackLevelInfo>::operator[]
                              (&(pIVar2->DebugStackTool).Results,iVar1),
          (pIVar4->QuerySuccess & 1U) != 0 ||
          (pIVar4 = ImVector<ImGuiStackLevelInfo>::operator[]
                              (&(pIVar2->DebugStackTool).Results,iVar1),
          '\x02' < pIVar4->QueryFrameCount)))) {
        (pIVar2->DebugStackTool).StackLevel = (pIVar2->DebugStackTool).StackLevel + 1;
      }
      iVar1 = (pIVar2->DebugStackTool).StackLevel;
      if (iVar1 == -1) {
        pIVar2->DebugHookIdInfo = IVar5;
      }
      if ((-1 < iVar1) && (iVar1 < (pIVar2->DebugStackTool).Results.Size)) {
        pIVar4 = ImVector<ImGuiStackLevelInfo>::operator[](&(pIVar2->DebugStackTool).Results,iVar1);
        pIVar2->DebugHookIdInfo = pIVar4->ID;
        pIVar4 = ImVector<ImGuiStackLevelInfo>::operator[](&(pIVar2->DebugStackTool).Results,iVar1);
        pIVar4->QueryFrameCount = pIVar4->QueryFrameCount + '\x01';
      }
    }
  }
  return;
}

Assistant:

void ImGui::UpdateDebugToolStackQueries()
{
    ImGuiContext& g = *GImGui;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Clear hook when stack tool is not visible
    g.DebugHookIdInfo = 0;
    if (g.FrameCount != tool->LastActiveFrame + 1)
        return;

    // Update queries. The steps are: -1: query Stack, >= 0: query each stack item
    // We can only perform 1 ID Info query every frame. This is designed so the GetID() tests are cheap and constant-time
    const ImGuiID query_id = g.HoveredIdPreviousFrame ? g.HoveredIdPreviousFrame : g.ActiveId;
    if (tool->QueryId != query_id)
    {
        tool->QueryId = query_id;
        tool->StackLevel = -1;
        tool->Results.resize(0);
    }
    if (query_id == 0)
        return;

    // Advance to next stack level when we got our result, or after 2 frames (in case we never get a result)
    int stack_level = tool->StackLevel;
    if (stack_level >= 0 && stack_level < tool->Results.Size)
        if (tool->Results[stack_level].QuerySuccess || tool->Results[stack_level].QueryFrameCount > 2)
            tool->StackLevel++;

    // Update hook
    stack_level = tool->StackLevel;
    if (stack_level == -1)
        g.DebugHookIdInfo = query_id;
    if (stack_level >= 0 && stack_level < tool->Results.Size)
    {
        g.DebugHookIdInfo = tool->Results[stack_level].ID;
        tool->Results[stack_level].QueryFrameCount++;
    }
}